

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::OlsonTimeZone::getOffset
          (OlsonTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t dom,uint8_t dow,
          int32_t millis,int32_t monthLength,UErrorCode *ec)

{
  UBool UVar1;
  double dVar2;
  int local_48;
  int local_44;
  int32_t dstoff;
  int32_t rawoff;
  UDate date;
  uint local_30;
  uint uStack_2c;
  uint8_t dow_local;
  int32_t dom_local;
  int32_t month_local;
  int32_t year_local;
  uint8_t era_local;
  OlsonTimeZone *this_local;
  
  date._7_1_ = dow;
  local_30 = dom;
  uStack_2c = month;
  dom_local = year;
  month_local._3_1_ = era;
  _year_local = this;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    if ((((((month_local._3_1_ == 1) || (month_local._3_1_ == 0)) && (-1 < (int)uStack_2c)) &&
         ((((int)uStack_2c < 0xc && (0 < (int)local_30)) &&
          (((int)local_30 <= monthLength && ((date._7_1_ != 0 && (date._7_1_ < 8)))))))) &&
        (-1 < millis)) && (((millis < 86400000 && (0x1b < monthLength)) && (monthLength < 0x20)))) {
      if (month_local._3_1_ == 0) {
        dom_local = -dom_local;
      }
      if ((this->finalZone == (SimpleTimeZone *)0x0) || (dom_local < this->finalStartYear)) {
        dVar2 = Grego::fieldsToDay(dom_local,uStack_2c,local_30);
        _dstoff = dVar2 * 86400000.0 + (double)millis;
        getHistoricalOffset(this,_dstoff,'\x01',3,1,&local_44,&local_48);
        this_local._4_4_ = local_44 + local_48;
      }
      else {
        this_local._4_4_ =
             (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                       (this->finalZone,(ulong)month_local._3_1_,(ulong)(uint)dom_local,
                        (ulong)uStack_2c,(ulong)local_30,(ulong)date._7_1_,millis,monthLength,ec);
      }
    }
    else {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t OlsonTimeZone::getOffset(uint8_t era, int32_t year, int32_t month,
                                 int32_t dom, uint8_t dow,
                                 int32_t millis, int32_t monthLength,
                                 UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return 0;
    }

    if ((era != GregorianCalendar::AD && era != GregorianCalendar::BC)
        || month < UCAL_JANUARY
        || month > UCAL_DECEMBER
        || dom < 1
        || dom > monthLength
        || dow < UCAL_SUNDAY
        || dow > UCAL_SATURDAY
        || millis < 0
        || millis >= U_MILLIS_PER_DAY
        || monthLength < 28
        || monthLength > 31) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if (era == GregorianCalendar::BC) {
        year = -year;
    }

    if (finalZone != NULL && year >= finalStartYear) {
        return finalZone->getOffset(era, year, month, dom, dow,
                                    millis, monthLength, ec);
    }

    // Compute local epoch millis from input fields
    UDate date = (UDate)(Grego::fieldsToDay(year, month, dom) * U_MILLIS_PER_DAY + millis);
    int32_t rawoff, dstoff;
    getHistoricalOffset(date, TRUE, kDaylight, kStandard, rawoff, dstoff);
    return rawoff + dstoff;
}